

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsprg.cpp
# Opt level: O0

void __thiscall CTcParser::write_to_object_file(CTcParser *this,CVmFile *fp)

{
  undefined8 in_RSI;
  CTcPrsSymtab *in_RDI;
  ulong exp_cnt;
  CTcPrsExport *exp;
  ulong prod_cnt;
  CTcGramProdEntry *prod;
  CTcSymObj *anon_obj;
  tcprs_nonsym_obj *nonsym;
  ulong nonsym_cnt;
  ulong anon_cnt;
  long end_ofs;
  long cnt_ofs;
  prs_wsf_ctx ctx;
  undefined4 in_stack_ffffffffffffff78;
  uint in_stack_ffffffffffffff7c;
  CTcPrsExport *local_70;
  CTcGramProdEntry *local_60;
  CTcPrsSymtab *pCVar1;
  CVmFile *fp_00;
  long lVar2;
  CTcPrsExport *this_00;
  
  in_RDI[7].end_ofs_ = 1;
  in_RDI[7].start_ofs_ = 1;
  CVmFile::get_pos((CVmFile *)in_RDI);
  CVmFile::write_uint4((CVmFile *)in_RDI,in_stack_ffffffffffffff7c);
  CVmFile::write_uint4((CVmFile *)in_RDI,in_stack_ffffffffffffff7c);
  CVmFile::write_uint4((CVmFile *)in_RDI,in_stack_ffffffffffffff7c);
  CTcPrsSymtab::enum_entries
            (in_RDI,(_func_void_void_ptr_CTcSymbol_ptr *)
                    CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),(void *)0x214fad);
  for (pCVar1 = in_RDI[8].parent_; pCVar1 != (CTcPrsSymtab *)0x0; pCVar1 = pCVar1->parent_) {
  }
  CVmFile::write_uint4((CVmFile *)in_RDI,in_stack_ffffffffffffff7c);
  for (pCVar1 = in_RDI[8].parent_; pCVar1 != (CTcPrsSymtab *)0x0; pCVar1 = pCVar1->parent_) {
    (*pCVar1->_vptr_CTcPrsSymtab[9])(pCVar1,in_RSI);
  }
  lVar2._0_4_ = in_RDI[8].start_ofs_;
  lVar2._4_4_ = in_RDI[8].end_ofs_;
  for (; lVar2 != 0; lVar2 = *(long *)(lVar2 + 8)) {
  }
  CVmFile::write_uint4((CVmFile *)in_RDI,in_stack_ffffffffffffff7c);
  for (this_00 = *(CTcPrsExport **)&in_RDI[8].start_ofs_; this_00 != (CTcPrsExport *)0x0;
      this_00 = (CTcPrsExport *)this_00->sym_len_) {
    CVmFile::write_uint4((CVmFile *)in_RDI,in_stack_ffffffffffffff7c);
  }
  CVmFile::get_pos((CVmFile *)in_RDI);
  CVmFile::set_pos((CVmFile *)in_RDI,CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  CVmFile::write_uint4((CVmFile *)in_RDI,in_stack_ffffffffffffff7c);
  CVmFile::write_uint4((CVmFile *)in_RDI,in_stack_ffffffffffffff7c);
  CVmFile::write_uint4((CVmFile *)in_RDI,in_stack_ffffffffffffff7c);
  CVmFile::set_pos((CVmFile *)in_RDI,CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  CVmFile::get_pos((CVmFile *)in_RDI);
  CVmFile::write_uint4((CVmFile *)in_RDI,in_stack_ffffffffffffff7c);
  CTcPrsSymtab::enum_entries
            (in_RDI,(_func_void_void_ptr_CTcSymbol_ptr *)
                    CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),(void *)0x215171);
  CVmFile::get_pos((CVmFile *)in_RDI);
  CVmFile::set_pos((CVmFile *)in_RDI,CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  CVmFile::write_uint4((CVmFile *)in_RDI,in_stack_ffffffffffffff7c);
  CVmFile::set_pos((CVmFile *)in_RDI,CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  CVmFile::write_uint4((CVmFile *)in_RDI,in_stack_ffffffffffffff7c);
  for (pCVar1 = in_RDI[8].parent_; pCVar1 != (CTcPrsSymtab *)0x0; pCVar1 = pCVar1->parent_) {
    (*pCVar1->_vptr_CTcPrsSymtab[10])(pCVar1,in_RSI);
  }
  fp_00 = (CVmFile *)0x0;
  for (local_60 = *(CTcGramProdEntry **)&in_RDI[6].list_index_; local_60 != (CTcGramProdEntry *)0x0;
      local_60 = CTcGramProdEntry::get_next(local_60)) {
  }
  CVmFile::write_uint4((CVmFile *)in_RDI,in_stack_ffffffffffffff7c);
  for (local_60 = *(CTcGramProdEntry **)&in_RDI[6].list_index_; local_60 != (CTcGramProdEntry *)0x0;
      local_60 = CTcGramProdEntry::get_next(local_60)) {
    CTcGramProdEntry::write_to_obj_file((CTcGramProdEntry *)this_00,fp_00);
  }
  CVmFile::get_pos((CVmFile *)in_RDI);
  CVmFile::write_uint4((CVmFile *)in_RDI,in_stack_ffffffffffffff7c);
  CTcPrsSymtab::enum_entries
            (in_RDI,(_func_void_void_ptr_CTcSymbol_ptr *)
                    CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),(void *)0x2152c7);
  CVmFile::get_pos((CVmFile *)in_RDI);
  CVmFile::set_pos((CVmFile *)in_RDI,CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  CVmFile::write_uint4((CVmFile *)in_RDI,in_stack_ffffffffffffff7c);
  CVmFile::set_pos((CVmFile *)in_RDI,CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  for (local_70 = *(CTcPrsExport **)&in_RDI[9].list_index_; local_70 != (CTcPrsExport *)0x0;
      local_70 = CTcPrsExport::get_next(local_70)) {
  }
  CVmFile::write_uint4((CVmFile *)in_RDI,in_stack_ffffffffffffff7c);
  for (local_70 = *(CTcPrsExport **)&in_RDI[9].list_index_; local_70 != (CTcPrsExport *)0x0;
      local_70 = CTcPrsExport::get_next(local_70)) {
    CTcPrsExport::write_to_obj_file(this_00,fp_00);
  }
  return;
}

Assistant:

void CTcParser::write_to_object_file(CVmFile *fp)
{
    prs_wsf_ctx ctx;
    long cnt_ofs;
    long end_ofs;
    ulong anon_cnt;
    ulong nonsym_cnt;
    tcprs_nonsym_obj *nonsym;
    CTcSymObj *anon_obj;
    CTcGramProdEntry *prod;
    ulong prod_cnt;
    CTcPrsExport *exp;
    ulong exp_cnt;

    /* 
     *   reset the object file symbol and dictionary index values - start
     *   with 1, since 0 is a "null pointer" index value 
     */
    obj_file_sym_idx_ = 1;
    obj_file_dict_idx_ = 1;

    /* 
     *   write a placeholder for the symbol index table count, the
     *   dictionary table count, and the actual symbol count 
     */
    cnt_ofs = fp->get_pos();
    fp->write_uint4(0);
    fp->write_uint4(0);
    fp->write_uint4(0);

    /* write each entry from the global symbol table */
    ctx.cnt = 0;
    ctx.fp = fp;
    ctx.prs = this;
    global_symtab_->enum_entries(&write_obj_cb, &ctx);

    /* count the anonymous objects */
    for (anon_cnt = 0, anon_obj = anon_obj_head_ ; anon_obj != 0 ;
         ++anon_cnt, anon_obj = (CTcSymObj *)anon_obj->nxt_) ;

    /* write the number of anonymous objects */
    fp->write_uint4(anon_cnt);

    /* write the anonymous objects */
    for (anon_obj = anon_obj_head_ ; anon_obj != 0 ;
         anon_obj = (CTcSymObj *)anon_obj->nxt_)
    {
        /* write this anonymous object */
        anon_obj->write_to_obj_file(fp);
    }

    /* count the non-symbol objects */
    for (nonsym_cnt = 0, nonsym = nonsym_obj_head_ ; nonsym != 0 ;
         ++nonsym_cnt, nonsym = nonsym->nxt_) ;

    /* write the non-symbol object ID's */
    fp->write_uint4(nonsym_cnt);
    for (nonsym = nonsym_obj_head_ ; nonsym != 0 ; nonsym = nonsym->nxt_)
        fp->write_uint4((ulong)nonsym->id_);

    /* remember where we are, and seek back to the counters for fixup */
    end_ofs = fp->get_pos();
    fp->set_pos(cnt_ofs);

    /* write the actual symbol index count */
    fp->write_uint4(obj_file_sym_idx_);

    /* write the actual dictionary index count */
    fp->write_uint4(obj_file_dict_idx_);

    /* write the total named symbol count */
    fp->write_uint4(ctx.cnt);

    /* 
     *   seek back to the ending offset so we can continue on to write the
     *   remainder of the file 
     */
    fp->set_pos(end_ofs);

    /* write a placeholder for the symbol cross-reference entries */
    cnt_ofs = fp->get_pos();
    fp->write_uint4(0);

    /* 
     *   enumerate entries again, this time writing cross-object
     *   references (this must be done after we've written out the main
     *   part of each object, so that we have a full table of all of the
     *   objects loaded before we write any references) 
     */
    ctx.cnt = 0;
    global_symtab_->enum_entries(&write_obj_ref_cb, &ctx);

    /* go back and fix up the cross-reference count */
    end_ofs = fp->get_pos();
    fp->set_pos(cnt_ofs);
    fp->write_uint4(ctx.cnt);
    fp->set_pos(end_ofs);

    /* write the anonymous object cross-references */
    fp->write_uint4(anon_cnt);
    for (anon_obj = anon_obj_head_ ; anon_obj != 0 ;
         anon_obj = (CTcSymObj *)anon_obj->nxt_)
    {
        /* write this anonymous object's cross-references */
        anon_obj->write_refs_to_obj_file(fp);
    }

    /* count the grammar productions */
    for (prod_cnt = 0, prod = gramprod_head_ ; prod != 0 ;
         ++prod_cnt, prod = prod->get_next()) ;

    /* write the number of productions */
    fp->write_uint4(prod_cnt);

    /* 
     *   write the main list of grammar rules - this is the list of
     *   productions that are associated with anonymous match objects and
     *   hence cannot be replaced or modified 
     */
    for (prod = gramprod_head_ ; prod != 0 ; prod = prod->get_next())
    {
        /* write this entry */
        prod->write_to_obj_file(fp);
    }

    /* write a placeholder for the named grammar rule count */
    cnt_ofs = fp->get_pos();
    fp->write_uint4(0);

    /* 
     *   write the private grammar rules - this is the set of rules
     *   associated with named match objects, so we write these by
     *   enumerating the symbol table again through the grammar rule writer
     *   callback 
     */
    ctx.cnt = 0;
    global_symtab_->enum_entries(&write_obj_gram_cb, &ctx);

    /* go back and fix up the named grammar rule count */
    end_ofs = fp->get_pos();
    fp->set_pos(cnt_ofs);
    fp->write_uint4(ctx.cnt);
    fp->set_pos(end_ofs);

    /* count the exports */
    for (exp_cnt = 0, exp = exp_head_ ; exp != 0 ;
         ++exp_cnt, exp = exp->get_next());

    /* write the number of exports */
    fp->write_uint4(exp_cnt);

    /* write the exports */
    for (exp = exp_head_ ; exp != 0 ; exp = exp->get_next())
    {
        /* write this entry */
        exp->write_to_obj_file(fp);
    }
}